

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O3

void __thiscall
QPDFAcroFormDocumentHelper::transformAnnotations
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *old_annots,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_annots,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_fields,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *old_fields,
          QPDFMatrix *cm,QPDF *from_qpdf,QPDFAcroFormDocumentHelper *from_afdh)

{
  string *key;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  QPDFObjectHandle *pQVar2;
  Rectangle r;
  element_type *peVar3;
  QPDFMatrix *pQVar4;
  _Atomic_word *p_Var5;
  size_type sVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined8 uVar8;
  undefined8 this_00;
  QPDFMatrix *other;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  undefined7 extraout_var_00;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  QPDFObjGen *pQVar15;
  QPDFObjGen QVar16;
  QPDF_Dictionary *pQVar17;
  _Rb_tree_node_base *p_Var18;
  _Base_ptr p_Var19;
  _Node *p_Var20;
  const_iterator cVar21;
  mapped_type *value;
  long *plVar22;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *extraout_RAX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  element_type *peVar24;
  double *pdVar25;
  int i;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  QPDFObjGen QVar27;
  QPDFAcroFormDocumentHelper *pQVar28;
  _Base_ptr p_Var29;
  _Rb_tree_node_base *p_Var30;
  QPDFAnnotationObjectHelper ah;
  bool have_parent;
  Matrix m1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  dr_map;
  QPDFObjectHandle dr;
  list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> queue;
  QPDFObjectHandle new_matrix;
  string default_da;
  QPDFObjectHandle acroform;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> streams;
  QPDFObjectHandle dict;
  QPDFObjectHandle apdict;
  QPDFObjectHandle parent;
  QPDFObjectHandle from_acroform;
  QPDFObjGen parent_og;
  Rectangle rect;
  string from_default_da;
  anon_class_16_2_6a8246dc maybe_copy_object;
  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  orig_to_copy;
  iterator __begin1;
  iterator __end1;
  set added_new_fields;
  QPDFAnnotationObjectHelper local_548;
  byte local_50a;
  bool local_509;
  undefined1 local_508 [16];
  undefined1 local_4f8 [48];
  string local_4c8;
  undefined1 local_4a8 [8];
  QPDFObjGen QStack_4a0;
  QPDFObjGen local_498;
  _Base_ptr local_490;
  _Base_ptr local_488;
  size_t local_480;
  QPDFObjectHandle *local_470;
  QPDFObjectHandle local_468;
  QPDFObjectHandle local_458;
  QPDFObjectHandle local_448;
  undefined4 local_434;
  undefined1 local_430 [48];
  QPDFMatrix local_400;
  undefined1 local_3d0 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  element_type *local_3a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  undefined1 local_398 [32];
  undefined1 local_378 [24];
  undefined1 local_360 [16];
  undefined1 local_350 [40];
  undefined1 local_328 [48];
  undefined1 local_2f8 [32];
  QPDFMatrix local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  ulong local_288;
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  *local_280;
  QPDFAcroFormDocumentHelper *local_278;
  QPDFObjectHandle local_270;
  QPDFObjectHandle local_260;
  QPDFObjGen local_250;
  QPDFObjGen local_248;
  QPDFObjGen local_240;
  QPDFObjGen local_238;
  QPDFObjectHandle local_230;
  QPDFObjectHandle local_220;
  QPDFObjectHandle local_210;
  QPDFObjGen local_200;
  element_type *local_1f8;
  QPDFObjGen local_1f0;
  QPDFObjGen local_1e8;
  QPDFObjectHandle local_1e0;
  QPDFArrayItems local_1d0;
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  local_1c0;
  QPDFObjGen local_190;
  QPDFObjGen local_188;
  QPDFObjGen local_180;
  QPDFObjGen local_178;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  *local_170;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_168;
  QPDFMatrix *local_160;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  QPDFObjGen local_140;
  iterator local_138;
  iterator local_110;
  Rectangle local_e8;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_98;
  QPDFAnnotationObjectHelper local_68;
  undefined7 extraout_var;
  
  local_350._32_8_ = (this->super_QPDFDocumentHelper).qpdf;
  local_170 = &old_fields->_M_t;
  local_168 = new_fields;
  local_158 = new_annots;
  if (from_qpdf == (QPDF *)0x0) {
    local_350._16_4_ = 0;
    local_350._20_4_ = 0;
    local_470 = (QPDFObjectHandle *)local_350._32_8_;
    local_350._24_8_ = this;
  }
  else {
    local_350._24_8_ = from_afdh;
    local_470 = (QPDFObjectHandle *)from_qpdf;
    if (from_afdh == (QPDFAcroFormDocumentHelper *)0x0 && (QPDF *)local_350._32_8_ != from_qpdf) {
      local_3d0._0_8_ = (QPDFAcroFormDocumentHelper *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d0 + 8),
                 (QPDFAcroFormDocumentHelper **)local_3d0,
                 (allocator<QPDFAcroFormDocumentHelper> *)&local_548,from_qpdf);
      local_350._24_8_ = local_3d0._0_8_;
      local_350._16_8_ = local_3d0._8_8_;
      local_350._32_8_ = (this->super_QPDFDocumentHelper).qpdf;
    }
    else {
      local_350._16_4_ = 0;
      local_350._20_4_ = 0;
    }
  }
  QPDF::getRoot((QPDF *)&local_548);
  pQVar28 = (QPDFAcroFormDocumentHelper *)(local_3d0 + 0x10);
  local_3d0._0_8_ = pQVar28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"/AcroForm","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_398,(string *)&local_548);
  if ((QPDFAcroFormDocumentHelper *)local_3d0._0_8_ != pQVar28) {
    operator_delete((void *)local_3d0._0_8_,CONCAT71(local_3d0._17_7_,local_3d0[0x10]) + 1);
  }
  if ((QPDFObjGen)
      local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  QPDF::getRoot((QPDF *)&local_548);
  local_3d0._0_8_ = pQVar28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"/AcroForm","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_2f8,(string *)&local_548);
  if ((QPDFAcroFormDocumentHelper *)local_3d0._0_8_ != pQVar28) {
    operator_delete((void *)local_3d0._0_8_,CONCAT71(local_3d0._17_7_,local_3d0[0x10]) + 1);
  }
  if ((QPDFObjGen)
      local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  local_2a8._M_allocated_capacity = (size_type)&local_298;
  local_2a8._8_4_ = 0;
  local_2a8._12_4_ = 0;
  local_298._M_local_buf[0] = '\0';
  QPDFObjectHandle::newNull();
  local_2f8._16_8_ = this;
  local_160 = cm;
  if (local_470 == (QPDFObjectHandle *)local_350._32_8_) {
    local_4c8.field_2._12_4_ = 0;
    local_434 = 0;
    local_4f8._44_4_ = 0;
  }
  else {
    local_3d0._8_4_ = 0;
    local_3d0._12_4_ = 0;
    local_3d0[0x10] = '\0';
    local_3d0._0_8_ = pQVar28;
    bVar9 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_398);
    uVar11 = 0;
    if (bVar9) {
      p_Var23 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
      local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var23;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/DA","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4a8,(string *)local_398);
      bVar9 = QPDFObjectHandle::isString((QPDFObjectHandle *)local_4a8);
      if (QStack_4a0 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4a0);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var23) {
        operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 1));
      }
      if (bVar9) {
        local_4a8 = (undefined1  [8])&local_498;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"/DA","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_1c0,(string *)local_398);
        QPDFObjectHandle::getUTF8Value_abi_cxx11_
                  ((string *)&local_548,(QPDFObjectHandle *)&local_1c0);
        std::__cxx11::string::operator=((string *)local_3d0,(string *)&local_548);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var23) {
          operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(local_1c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                     local_1c0._M_impl.super__Rb_tree_header._M_header._M_color) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_1c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                              local_1c0._M_impl.super__Rb_tree_header._M_header._M_color));
        }
        this = (QPDFAcroFormDocumentHelper *)local_2f8._16_8_;
        if (local_4a8 != (undefined1  [8])&local_498) {
          operator_delete((void *)local_4a8,(ulong)((long)(_Rb_tree_color *)local_498 + 1));
          this = (QPDFAcroFormDocumentHelper *)local_2f8._16_8_;
        }
      }
      local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var23;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/Q","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4a8,(string *)local_398);
      bVar9 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_4a8);
      if (QStack_4a0 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4a0);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var23) {
        operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 1));
      }
      uVar11 = 0;
      if (bVar9) {
        local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var23;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/Q","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4a8,(string *)local_398);
        uVar11 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_4a8);
        if (QStack_4a0 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4a0);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var23) {
          operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
        }
      }
    }
    bVar9 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_2f8);
    uVar14 = CONCAT71(extraout_var,bVar9);
    local_4c8.field_2._12_4_ = 0;
    if (bVar9) {
      p_Var23 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
      local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var23;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/DR","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4a8,(string *)local_2f8);
      bVar9 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_4a8);
      if (QStack_4a0 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4a0);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var23) {
        operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 1));
      }
      if (bVar9) {
        local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var23;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/DR","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4a8,(string *)local_2f8);
        _Var7._M_pi = local_458.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_458.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4a0;
        local_458.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_4a8;
        local_4a8._0_4_ = 0;
        local_4a8._4_4_ = 0;
        QStack_4a0.obj = 0;
        QStack_4a0.gen = 0;
        if (((QPDFObjGen)_Var7._M_pi != (QPDFObjGen)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
           QStack_4a0 != (QPDFObjGen)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4a0);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var23) {
          operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
        }
        bVar9 = QPDFObjectHandle::isIndirect(&local_458);
        if (!bVar9) {
          local_180 = (QPDFObjGen)
                      local_458.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_178 = (QPDFObjGen)
                      local_458.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((QPDFObjGen)
              local_458.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)
               ((long)local_458.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
               8) = *(_Atomic_word *)
                     ((long)local_458.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)
               ((long)local_458.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
               8) = *(_Atomic_word *)
                     ((long)local_458.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 8) + 1;
            }
          }
          QPDF::makeIndirectObject((QPDF *)&local_548,local_470);
          _Var7._M_pi = local_458.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          local_458.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_458.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
          local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
          local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          if (((QPDFObjGen)_Var7._M_pi != (QPDFObjGen)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
             (QPDFObjGen)
             local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0))
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if (local_178 != (QPDFObjGen)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178);
          }
        }
        pQVar2 = (QPDFObjectHandle *)(this->super_QPDFDocumentHelper).qpdf;
        local_190 = (QPDFObjGen)
                    local_458.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_188 = (QPDFObjGen)
                    local_458.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((QPDFObjGen)
            local_458.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_458.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8
             ) = *(_Atomic_word *)
                  ((long)local_458.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_458.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8
             ) = *(_Atomic_word *)
                  ((long)local_458.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 8) + 1;
          }
        }
        QPDF::copyForeignObject((QPDF *)&local_548,pQVar2);
        _Var7._M_pi = local_458.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_458.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_458.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
        local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
        local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        if (((QPDFObjGen)_Var7._M_pi != (QPDFObjGen)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
           (QPDFObjGen)
           local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (local_188 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188);
        }
      }
      local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var23;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/DA","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4a8,(string *)local_2f8);
      bVar9 = QPDFObjectHandle::isString((QPDFObjectHandle *)local_4a8);
      if (QStack_4a0 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4a0);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var23) {
        operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 1));
      }
      if (bVar9) {
        local_4a8 = (undefined1  [8])&local_498;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"/DA","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_1c0,(string *)local_2f8);
        QPDFObjectHandle::getUTF8Value_abi_cxx11_
                  ((string *)&local_548,(QPDFObjectHandle *)&local_1c0);
        std::__cxx11::string::operator=((string *)local_2a8._M_local_buf,(string *)&local_548);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var23) {
          operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(local_1c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                     local_1c0._M_impl.super__Rb_tree_header._M_header._M_color) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_1c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                              local_1c0._M_impl.super__Rb_tree_header._M_header._M_color));
        }
        this = (QPDFAcroFormDocumentHelper *)local_2f8._16_8_;
        if (local_4a8 != (undefined1  [8])&local_498) {
          operator_delete((void *)local_4a8,(ulong)((long)(_Rb_tree_color *)local_498 + 1));
          this = (QPDFAcroFormDocumentHelper *)local_2f8._16_8_;
        }
      }
      local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var23;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/Q","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4a8,(string *)local_2f8);
      bVar9 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_4a8);
      uVar14 = CONCAT71(extraout_var_00,bVar9);
      if (QStack_4a0 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4a0);
        uVar14 = extraout_RAX;
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var23) {
        operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 1));
        uVar14 = extraout_RAX_00;
      }
      if (bVar9) {
        local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var23;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/Q","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_4a8,(string *)local_2f8);
        local_4c8.field_2._12_4_ = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_4a8)
        ;
        uVar14 = (ulong)(uint)local_4c8.field_2._12_4_;
        if (QStack_4a0 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QStack_4a0);
          uVar14 = extraout_RAX_01;
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var23) {
          operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
          uVar14 = extraout_RAX_02;
        }
      }
    }
    uVar8 = local_3d0._0_8_;
    if (local_2a8._8_8_ == local_3d0._8_8_) {
      if ((QPDFObjGen)local_2a8._8_8_ == (QPDFObjGen)0x0) {
        local_4f8._44_4_ = 0;
      }
      else {
        iVar12 = bcmp((void *)local_2a8._M_allocated_capacity,(void *)local_3d0._0_8_,
                      local_2a8._8_8_);
        local_4f8._44_4_ = CONCAT31((int3)((uint)iVar12 >> 8),iVar12 != 0);
        uVar14 = (ulong)(uint)local_4f8._44_4_;
      }
    }
    else {
      uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
      local_4f8._44_4_ = (undefined4)uVar14;
    }
    local_434 = (undefined4)CONCAT71((int7)(uVar14 >> 8),local_4c8.field_2._12_4_ != uVar11);
    if ((QPDFAcroFormDocumentHelper *)uVar8 != pQVar28) {
      operator_delete((void *)uVar8,CONCAT71(local_3d0._17_7_,local_3d0[0x10]) + 1);
    }
  }
  local_490 = (_Base_ptr)&QStack_4a0;
  QStack_4a0 = (QPDFObjGen)((ulong)QStack_4a0 & 0xffffffff00000000);
  local_498 = (QPDFObjGen)0x0;
  local_480 = 0;
  local_488 = local_490;
  QPDFObjectHandle::newNull();
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_1c0._M_impl + 8);
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_280 = &local_1c0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_278 = this;
  local_1c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDFObjectHandle::aitems(old_annots);
  QPDFObjectHandle::QPDFArrayItems::begin(&local_138,&local_1d0);
  QPDFObjectHandle::QPDFArrayItems::end(&local_110,&local_1d0);
  local_50a = (byte)local_434 | local_4f8[0x2c];
  local_288 = 0;
  do {
    bVar9 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==(&local_138,&local_110);
    if (bVar9) {
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&local_110);
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&local_138);
      if (local_1d0.oh.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d0.oh.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree(&local_c8);
      std::
      _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
      ::~_Rb_tree(&local_1c0);
      if ((element_type *)
          local_448.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_448.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   *)local_4a8);
      if ((QPDFObjGen)
          local_458.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_458.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_allocated_capacity != &local_298) {
        operator_delete((void *)local_2a8._M_allocated_capacity,
                        CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]) +
                        1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_);
      }
      if ((QPDFObjGen)local_398._8_8_ != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._8_8_);
      }
      if ((QPDFObjGen)local_350._16_8_ != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._16_8_);
      }
      return;
    }
    pQVar15 = (QPDFObjGen *)QPDFObjectHandle::QPDFArrayItems::iterator::operator*(&local_138);
    local_4c8._M_dataplus._M_p = *(pointer *)pQVar15;
    local_4c8._M_string_length = *(size_type *)(pQVar15 + 1);
    if ((QPDFObjGen)local_4c8._M_string_length != (QPDFObjGen)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_4c8._M_string_length + 8) =
             *(_Atomic_word *)(local_4c8._M_string_length + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_4c8._M_string_length + 8) =
             *(_Atomic_word *)(local_4c8._M_string_length + 8) + 1;
      }
    }
    bVar9 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&local_4c8);
    if (bVar9) {
      local_3d0._0_8_ = local_3d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3d0,"ignoring annotation that\'s a stream","");
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_4c8,(string *)local_3d0);
      if ((QPDFAcroFormDocumentHelper *)local_3d0._0_8_ !=
          (QPDFAcroFormDocumentHelper *)(local_3d0 + 0x10)) {
        operator_delete((void *)local_3d0._0_8_,CONCAT71(local_3d0._17_7_,local_3d0[0x10]) + 1);
      }
    }
    else {
      local_1e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_4c8._M_dataplus._M_p;
      local_1e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._M_string_length
      ;
      if ((QPDFObjGen)local_4c8._M_string_length != (QPDFObjGen)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_4c8._M_string_length + 8) =
               *(_Atomic_word *)(local_4c8._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_4c8._M_string_length + 8) =
               *(_Atomic_word *)(local_4c8._M_string_length + 8) + 1;
        }
      }
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_68,&local_1e0);
      getFieldForAnnotation
                ((QPDFFormFieldObjectHelper *)local_3d0,
                 (QPDFAcroFormDocumentHelper *)local_350._24_8_,&local_68);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_68);
      if ((QPDFObjGen)
          local_1e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      local_468.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT71(local_3d0._17_7_,local_3d0[0x10]);
      local_468.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_3d0._8_8_;
      if ((element_type *)
          local_468.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5 = (_Atomic_word *)
                   ((long)&(((element_type *)
                            local_468.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *p_Var5 = *p_Var5 + 1;
          UNLOCK();
        }
        else {
          p_Var5 = (_Atomic_word *)
                   ((long)&(((element_type *)
                            local_468.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *p_Var5 = *p_Var5 + 1;
        }
      }
      local_430._24_4_ = 0;
      local_430._28_4_ = 0;
      local_430._32_4_ = 0;
      local_430._36_4_ = 0;
      local_509 = false;
      bVar9 = QPDFObjectHandle::isStream(&local_468);
      if (bVar9) {
        local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
             (_func_int **)((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_548,"ignoring form field that\'s a stream","");
        QPDFObjectHandle::warnIfPossible(&local_468,(string *)&local_548);
LAB_00154956:
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
            (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
          operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + 1));
        }
LAB_001549ab:
        bVar9 = false;
      }
      else {
        bVar9 = QPDFObjectHandle::isNull(&local_468);
        if ((!bVar9) && (bVar9 = QPDFObjectHandle::isIndirect(&local_468), !bVar9)) {
          local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_548,"ignoring form field not indirect","");
          QPDFObjectHandle::warnIfPossible(&local_468,(string *)&local_548);
          goto LAB_00154956;
        }
        bVar9 = QPDFObjectHandle::isNull(&local_468);
        if (bVar9) goto LAB_001549ab;
        QPDFFormFieldObjectHelper::getTopLevelField
                  ((QPDFFormFieldObjectHelper *)&local_548,(QPDFFormFieldObjectHelper *)local_3d0,
                   &local_509);
        uVar8 = local_430._32_8_;
        if ((QPDFObjGen)
            local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8
             ) = *(_Atomic_word *)
                  ((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8
             ) = *(_Atomic_word *)
                  ((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 8) + 1;
          }
        }
        local_430._24_8_ =
             local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_430._32_8_ =
             local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((QPDFObjGen)uVar8 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
        }
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)&local_548);
        if (local_470 == (QPDFObjectHandle *)local_350._32_8_) {
          local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)(local_430 + 0x18));
          std::
          _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
          ::_M_insert_unique<QPDFObjGen>(local_170,(QPDFObjGen *)&local_548);
        }
        else {
          pQVar2 = (QPDFObjectHandle *)(this->super_QPDFDocumentHelper).qpdf;
          local_1f0.obj = local_430._24_4_;
          local_1f0.gen = local_430._28_4_;
          local_1e8.obj = local_430._32_4_;
          local_1e8.gen = local_430._36_4_;
          if ((QPDFObjGen)local_430._32_8_ != (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_430._32_8_ + 8) = *(_Atomic_word *)(local_430._32_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_430._32_8_ + 8) = *(_Atomic_word *)(local_430._32_8_ + 8) + 1;
            }
          }
          QPDF::copyForeignObject((QPDF *)&local_548,pQVar2);
          uVar8 = local_430._32_8_;
          local_430._32_8_ =
               local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_430._24_8_ = local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
          local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
          local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          if (((QPDFObjGen)uVar8 != (QPDFObjGen)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8),
             local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if (local_1e8 != (QPDFObjGen)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8);
          }
          pQVar2 = (QPDFObjectHandle *)(this->super_QPDFDocumentHelper).qpdf;
          local_200 = (QPDFObjGen)
                      local_468.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1f8 = (element_type *)
                      local_468.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((element_type *)
              local_468.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_468.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_468.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_468.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_468.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          QPDF::copyForeignObject((QPDF *)&local_548,pQVar2);
          _Var7._M_pi = local_468.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          local_468.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_468.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
          local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
          local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          if (((element_type *)_Var7._M_pi != (element_type *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
             (QPDFObjGen)
             local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0))
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if (local_1f8 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8);
          }
        }
        local_430._0_8_ = local_430;
        local_430._16_8_ = 0;
        local_2d8.b = (double)((ulong)local_2d8.b & 0xffffffff00000000);
        local_2d8.c = 0.0;
        local_2d8.d = (double)&local_2d8.b;
        local_2d8.f = 0.0;
        local_430._8_8_ = local_430._0_8_;
        local_2d8.e = local_2d8.d;
        bVar9 = transformAnnotations::anon_class_16_2_6a8246dc::operator()
                          ((anon_class_16_2_6a8246dc *)&local_280,
                           (QPDFObjectHandle *)(local_430 + 0x18));
        if (bVar9) {
          p_Var20 = std::__cxx11::list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
                    _M_create_node<QPDFObjectHandle_const&>
                              ((list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)local_430,
                               (QPDFObjectHandle *)(local_430 + 0x18));
          std::__detail::_List_node_base::_M_hook(&p_Var20->super__List_node_base);
          local_430._16_8_ = local_430._16_8_ + 1;
        }
        if ((element_type *)local_430._0_8_ != (element_type *)local_430) {
          do {
            uVar8 = local_430._0_8_;
            key = (string *)(local_430._0_8_ + 0x10);
            QVar16 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)key);
            bVar9 = QPDFObjGen::set::add((set *)&local_2d8,QVar16);
            if (bVar9) {
              local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                   (_func_int **)((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/Parent","");
              QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_328 + 0x20),key);
              if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                  (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi + 1));
              }
              bVar9 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)(local_328 + 0x20));
              if (bVar9) {
                local_2f8._24_8_ =
                     QPDFObjectHandle::getObjGen((QPDFObjectHandle *)(local_328 + 0x20));
                cVar21 = std::
                         _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                         ::find(&local_1c0,(key_type *)(local_2f8 + 0x18));
                if ((_Rb_tree_header *)cVar21._M_node ==
                    (_Rb_tree_header *)((long)&local_1c0._M_impl + 8U)) {
                  local_140 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)key);
                  QPDFObjGen::unparse_abi_cxx11_((string *)local_328,&local_140,',');
                  plVar22 = (long *)std::__cxx11::string::replace
                                              ((ulong)local_328,0,(char *)0x0,0x26165c);
                  local_398._16_8_ = local_378;
                  peVar24 = (element_type *)(plVar22 + 2);
                  if ((element_type *)*plVar22 == peVar24) {
                    local_378._0_8_ =
                         *(undefined8 *)
                          &(peVar24->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ;
                    local_378._8_8_ = plVar22[3];
                  }
                  else {
                    local_378._0_8_ =
                         *(undefined8 *)
                          &(peVar24->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ;
                    local_398._16_8_ = (element_type *)*plVar22;
                  }
                  local_398._24_8_ = plVar22[1];
                  *plVar22 = (long)peVar24;
                  plVar22[1] = 0;
                  *(undefined1 *)(plVar22 + 2) = 0;
                  plVar22 = (long *)std::__cxx11::string::append(local_398 + 0x10);
                  local_400.a = (double)&local_400.c;
                  pdVar25 = (double *)(plVar22 + 2);
                  if ((double *)*plVar22 == pdVar25) {
                    local_400.c = *pdVar25;
                    local_400.d = (double)plVar22[3];
                  }
                  else {
                    local_400.c = *pdVar25;
                    local_400.a = (double)*plVar22;
                  }
                  local_400.b = (double)plVar22[1];
                  *plVar22 = (long)pdVar25;
                  plVar22[1] = 0;
                  *(undefined1 *)(plVar22 + 2) = 0;
                  QPDFObjGen::unparse_abi_cxx11_
                            ((string *)local_360,(QPDFObjGen *)(local_2f8 + 0x18),',');
                  p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
                  if ((double *)local_400.a != &local_400.c) {
                    p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400.c;
                  }
                  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)(_func_int ***)local_400.b + local_360._8_8_);
                  if (p_Var26 < p_Var1) {
                    p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
                    if ((element_type *)local_360._0_8_ != (element_type *)local_350) {
                      p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._0_8_;
                    }
                    if (p_Var26 < p_Var1) goto LAB_00155820;
                    plVar22 = (long *)std::__cxx11::string::replace
                                                ((ulong)local_360,0,(char *)0x0,(ulong)local_400.a);
                  }
                  else {
LAB_00155820:
                    plVar22 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_400,local_360._0_8_);
                  }
                  local_508._0_8_ = local_4f8;
                  peVar24 = (element_type *)(plVar22 + 2);
                  if ((element_type *)*plVar22 == peVar24) {
                    local_4f8._0_8_ =
                         *(undefined8 *)
                          &(peVar24->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ;
                    local_4f8._8_8_ = plVar22[3];
                  }
                  else {
                    local_4f8._0_8_ =
                         *(undefined8 *)
                          &(peVar24->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ;
                    local_508._0_8_ = (element_type *)*plVar22;
                  }
                  local_508._8_8_ = plVar22[1];
                  *plVar22 = (long)peVar24;
                  plVar22[1] = 0;
                  *(undefined1 *)
                   &(peVar24->value).
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       = 0;
                  pQVar15 = (QPDFObjGen *)std::__cxx11::string::append(local_508);
                  local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                       (_func_int **)((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
                  QVar16 = (QPDFObjGen)(pQVar15 + 2);
                  if (*pQVar15 == QVar16) {
                    local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)QVar16;
                    local_548.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         *(element_type **)(pQVar15 + 3);
                  }
                  else {
                    local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)QVar16;
                    local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)*pQVar15
                    ;
                  }
                  local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       *(element_type **)(pQVar15 + 1);
                  *pQVar15 = QVar16;
                  pQVar15[1].obj = 0;
                  pQVar15[1].gen = 0;
                  *(undefined1 *)&pQVar15[2].obj = 0;
                  QPDFObjectHandle::warnIfPossible
                            ((QPDFObjectHandle *)(local_328 + 0x20),(string *)&local_548);
                  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                    operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                    (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.
                                                  obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 1));
                  }
                  if ((element_type *)local_508._0_8_ != (element_type *)local_4f8) {
                    operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
                  }
                  if ((element_type *)local_360._0_8_ != (element_type *)local_350) {
                    operator_delete((void *)local_360._0_8_,local_350._0_8_ + 1);
                  }
                  if ((double *)local_400.a != &local_400.c) {
                    operator_delete((void *)local_400.a,
                                    (ulong)((long)(_func_int ***)local_400.c + 1));
                  }
                  if ((element_type *)local_398._16_8_ != (element_type *)local_378) {
                    operator_delete((void *)local_398._16_8_,local_378._0_8_ + 1);
                  }
                  QVar16 = (QPDFObjGen)local_328._16_8_;
                  QVar27 = (QPDFObjGen)local_328._0_8_;
                  if (local_328._0_8_ == (long)local_328 + 0x10) goto LAB_001559bd;
                }
                else {
                  local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                       (_func_int **)((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/Parent","")
                  ;
                  value = std::
                          map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                          ::operator[]((map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                                        *)&local_1c0,(key_type *)(local_2f8 + 0x18));
                  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)key,(string *)&local_548,value);
                  QVar16 = (QPDFObjGen)
                           local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
                  QVar27 = (QPDFObjGen)local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
                  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper ==
                      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8U))
                  goto LAB_001559bd;
                }
                operator_delete((void *)QVar27,(ulong)((long)QVar16 + 1));
              }
LAB_001559bd:
              local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                   (_func_int **)((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/Kids","");
              QPDFObjectHandle::getKey((QPDFObjectHandle *)local_328,key);
              if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                  (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi + 1));
              }
              pQVar28 = (QPDFAcroFormDocumentHelper *)local_328;
              bVar9 = QPDFObjectHandle::isArray((QPDFObjectHandle *)pQVar28);
              if (bVar9) {
                iVar12 = 0;
                while( true ) {
                  pQVar28 = (QPDFAcroFormDocumentHelper *)local_328;
                  iVar13 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)pQVar28);
                  if (iVar13 <= iVar12) break;
                  QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_548,(int)local_328);
                  bVar9 = transformAnnotations::anon_class_16_2_6a8246dc::operator()
                                    ((anon_class_16_2_6a8246dc *)&local_280,
                                     (QPDFObjectHandle *)&local_548);
                  if (bVar9) {
                    QPDFObjectHandle::setArrayItem
                              ((QPDFObjectHandle *)local_328,iVar12,(QPDFObjectHandle *)&local_548);
                    p_Var20 = std::__cxx11::list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>
                              ::_M_create_node<QPDFObjectHandle_const&>
                                        ((list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)
                                         local_430,(QPDFObjectHandle *)&local_548);
                    std::__detail::_List_node_base::_M_hook(&p_Var20->super__List_node_base);
                    local_430._16_8_ = local_430._16_8_ + 1;
                  }
                  if ((QPDFObjGen)
                      local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                      (QPDFObjGen)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                  }
                  iVar12 = iVar12 + 1;
                }
              }
              if (local_50a != 0) {
                local_210.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar8 + 0x10))->
                     _vptr__Sp_counted_base;
                local_210.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(uVar8 + 0x18);
                if (local_210.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_210.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = (local_210.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_210.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = (local_210.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                adjustInheritedFields
                          (pQVar28,&local_210,(bool)local_4f8[0x2c],(string *)&local_2a8,
                           local_434._0_1_,local_4c8.field_2._12_4_);
                if (local_210.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_210.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
              }
              if (local_470 != (QPDFObjectHandle *)local_350._32_8_) {
                if ((local_288 & 1) == 0) {
                  bVar9 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_398);
                  if (!bVar9) {
                    getOrCreateAcroForm((QPDFAcroFormDocumentHelper *)&local_548);
                    this_00 = local_398._8_8_;
                    local_398._8_8_ =
                         local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    local_398._0_8_ = local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
                    local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
                    local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    if (((QPDFObjGen)this_00 != (QPDFObjGen)0x0) &&
                       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
                       local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                       (element_type *)0x0)) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                    }
                  }
                  local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                       (_func_int **)((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
                  local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x3;
                  local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
                       = 0x52442f;
                  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_508,(string *)local_398);
                  _Var7._M_pi = local_448.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi;
                  local_448.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_;
                  local_448.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)local_508._0_8_;
                  local_508._0_8_ = (element_type *)0x0;
                  local_508._8_8_ = (element_type *)0x0;
                  if (((element_type *)_Var7._M_pi != (element_type *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
                     (element_type *)local_508._8_8_ != (element_type *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_);
                  }
                  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                    operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                    (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.
                                                  obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 1));
                  }
                  bVar9 = QPDFObjectHandle::isDictionary(&local_448);
                  if (!bVar9) {
                    QPDFObjectHandle::newDictionary();
                    _Var7._M_pi = local_448.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                    local_448.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    local_448.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
                    local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
                    local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    if (((element_type *)_Var7._M_pi != (element_type *)0x0) &&
                       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
                       local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                       (element_type *)0x0)) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                    }
                  }
                  QPDFObjectHandle::makeResourcesIndirect
                            (&local_448,(this->super_QPDFDocumentHelper).qpdf);
                  bVar9 = QPDFObjectHandle::isIndirect(&local_448);
                  if (!bVar9) {
                    local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                         (_func_int **)
                         ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
                    local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x3;
                    local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                    _0_4_ = 0x52442f;
                    pQVar2 = (QPDFObjectHandle *)(this->super_QPDFDocumentHelper).qpdf;
                    local_398._16_8_ =
                         local_448.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    local_398._24_8_ =
                         local_448.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi;
                    if ((element_type *)
                        local_448.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        != (element_type *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_448.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_M_use_count =
                             (local_448.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_448.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_M_use_count =
                             (local_448.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
                      }
                    }
                    QPDF::makeIndirectObject((QPDF *)&local_400,pQVar2);
                    QPDFObjectHandle::replaceKeyAndGetNew
                              ((QPDFObjectHandle *)local_508,(string *)local_398,
                               (QPDFObjectHandle *)&local_548);
                    _Var7._M_pi = local_448.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                    local_448.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_;
                    local_448.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)local_508._0_8_;
                    local_508._0_8_ = (element_type *)0x0;
                    local_508._8_8_ = (element_type *)0x0;
                    if (((element_type *)_Var7._M_pi != (element_type *)0x0) &&
                       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
                       (element_type *)local_508._8_8_ != (element_type *)0x0)) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_);
                    }
                    if ((_Base_ptr)local_400.b != (_Base_ptr)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400.b);
                    }
                    if ((element_type *)local_398._24_8_ != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._24_8_);
                    }
                    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                        local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                      operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                      (ulong)((long)local_548.super_QPDFObjectHelper.
                                                    super_BaseHandle.obj.
                                                                                                        
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 1));
                    }
                  }
                  QPDFObjectHandle::makeResourcesIndirect
                            (&local_458,(this->super_QPDFDocumentHelper).qpdf);
                  local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                       (_func_int **)
                       local_458.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)
                       local_458.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
                  if ((QPDFObjGen)
                      local_458.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (QPDFObjGen)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      *(_Atomic_word *)
                       ((long)local_458.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi + 8) =
                           *(_Atomic_word *)
                            ((long)local_458.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi + 8) + 1;
                      UNLOCK();
                    }
                    else {
                      *(_Atomic_word *)
                       ((long)local_458.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi + 8) =
                           *(_Atomic_word *)
                            ((long)local_458.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi + 8) + 1;
                    }
                  }
                  QPDFObjectHandle::mergeResources
                            (&local_448,(QPDFObjectHandle *)&local_548,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                              *)local_4a8);
                  if ((QPDFObjGen)
                      local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                      (QPDFObjGen)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                  }
                  bVar9 = getNeedAppearances((QPDFAcroFormDocumentHelper *)local_350._24_8_);
                  if (bVar9) {
                    setNeedAppearances(this,true);
                  }
                }
                local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                     (_func_int **)((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/DR","");
                bVar9 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)key,(string *)&local_548);
                if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                    (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                  operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                  (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.
                                                obj.
                                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi + 1));
                }
                if (bVar9) {
                  local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                       (_func_int **)((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/DR","");
                  QPDFObjectHandle::replaceKey
                            ((QPDFObjectHandle *)key,(string *)&local_548,&local_448);
                  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
                      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
                    operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                    (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.
                                                  obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 1));
                  }
                }
                local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                     (_func_int **)((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"/DA","");
                QPDFObjectHandle::getKey((QPDFObjectHandle *)local_508,key);
                bVar9 = QPDFObjectHandle::isString((QPDFObjectHandle *)local_508);
                bVar10 = local_480 != 0;
                if ((element_type *)local_508._8_8_ != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_);
                }
                p_Var23 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8);
                if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var23) {
                  operator_delete(local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                  (ulong)((long)local_548.super_QPDFObjectHelper.super_BaseHandle.
                                                obj.
                                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi + 1));
                  p_Var23 = extraout_RAX_03;
                }
                local_288 = CONCAT71((int7)((ulong)p_Var23 >> 8),1);
                if (bVar9 && bVar10) {
                  local_220.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar8 + 0x10))->
                       _vptr__Sp_counted_base;
                  local_220.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(uVar8 + 0x18);
                  if (local_220.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_220.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_M_use_count =
                           (local_220.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_220.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_M_use_count =
                           (local_220.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
                    }
                  }
                  adjustDefaultAppearances
                            (this,&local_220,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                              *)local_4a8);
                  if (local_220.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_220.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                }
              }
              if ((element_type *)local_328._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
              }
              if ((QPDFObjGen)local_328._40_8_ != (QPDFObjGen)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._40_8_);
              }
            }
            std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_erase
                      ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_430,
                       (iterator)local_430._0_8_);
          } while ((element_type *)local_430._0_8_ != (element_type *)local_430);
        }
        transformAnnotations::anon_class_16_2_6a8246dc::operator()
                  ((anon_class_16_2_6a8246dc *)&local_280,&local_468);
        local_230.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_468.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_230.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_468.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((element_type *)
            local_468.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_468.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_468.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_468.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_468.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)&local_548,&local_230);
        local_3d0._8_8_ =
             local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d0 + 0x10),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_548.super_QPDFObjectHelper.super_BaseHandle + 8));
        local_3d0._24_8_ =
             local_548.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_3b0,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_548.super_QPDFObjectHelper.oh_ + 8));
        local_3a8 = local_548.m.
                    super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_3a0,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_548.m.
                           super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                   + 8));
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)&local_548);
        if ((element_type *)
            local_230.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_230.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        std::
        _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
        ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                     *)&local_2d8);
        std::__cxx11::_List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_clear
                  ((_List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_430);
        bVar9 = true;
      }
      if (local_470 != (QPDFObjectHandle *)local_350._32_8_) {
        bVar10 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)&local_4c8);
        if (!bVar10) {
          local_240 = (QPDFObjGen)local_4c8._M_dataplus._M_p;
          local_238.obj = (undefined4)local_4c8._M_string_length;
          local_238.gen = local_4c8._M_string_length._4_4_;
          if ((QPDFObjGen)local_4c8._M_string_length != (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_4c8._M_string_length + 8) =
                   *(_Atomic_word *)(local_4c8._M_string_length + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_4c8._M_string_length + 8) =
                   *(_Atomic_word *)(local_4c8._M_string_length + 8) + 1;
            }
          }
          QPDF::makeIndirectObject((QPDF *)&local_548,local_470);
          sVar6 = local_4c8._M_string_length;
          local_4c8._M_string_length =
               (size_type)
               local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_4c8._M_dataplus._M_p =
               (pointer)local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
          local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
          local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          if (((QPDFObjGen)sVar6 != (QPDFObjGen)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6),
             (QPDFObjGen)
             local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0))
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if (local_238 != (QPDFObjGen)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238);
          }
        }
        pQVar2 = (QPDFObjectHandle *)(this->super_QPDFDocumentHelper).qpdf;
        local_250 = (QPDFObjGen)local_4c8._M_dataplus._M_p;
        local_248.obj = (undefined4)local_4c8._M_string_length;
        local_248.gen = local_4c8._M_string_length._4_4_;
        if ((QPDFObjGen)local_4c8._M_string_length != (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_4c8._M_string_length + 8) =
                 *(_Atomic_word *)(local_4c8._M_string_length + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_4c8._M_string_length + 8) =
                 *(_Atomic_word *)(local_4c8._M_string_length + 8) + 1;
          }
        }
        QPDF::copyForeignObject((QPDF *)&local_548,pQVar2);
        sVar6 = local_4c8._M_string_length;
        local_4c8._M_string_length =
             (size_type)
             local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_4c8._M_dataplus._M_p =
             (pointer)local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
        local_548.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)0x0;
        local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        if (((QPDFObjGen)sVar6 != (QPDFObjGen)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6),
           (QPDFObjGen)
           local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_548.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (local_248 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248);
        }
      }
      transformAnnotations::anon_class_16_2_6a8246dc::operator()
                ((anon_class_16_2_6a8246dc *)&local_280,(QPDFObjectHandle *)&local_4c8);
      if (bVar9) {
        QVar16 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)(local_430 + 0x18));
        bVar9 = QPDFObjGen::set::add((set *)&local_c8,QVar16);
        if (bVar9) {
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    (local_168,(value_type *)(local_430 + 0x18));
        }
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                (local_158,(value_type *)&local_4c8);
      local_260.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_4c8._M_dataplus._M_p;
      local_260.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._M_string_length
      ;
      if ((QPDFObjGen)local_4c8._M_string_length != (QPDFObjGen)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_4c8._M_string_length + 8) =
               *(_Atomic_word *)(local_4c8._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_4c8._M_string_length + 8) =
               *(_Atomic_word *)(local_4c8._M_string_length + 8) + 1;
        }
      }
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_548,&local_260);
      if ((QPDFObjGen)
          local_260.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_260.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)local_328);
      local_398._16_8_ = (element_type *)0x0;
      local_398._24_8_ = (element_type *)0x0;
      local_378._0_8_ = (_func_int **)0x0;
      local_508._0_8_ = local_328._0_8_;
      local_508._8_8_ = local_328._8_8_;
      if ((element_type *)local_328._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_328._8_8_ + 8) = *(_Atomic_word *)(local_328._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_328._8_8_ + 8) = *(_Atomic_word *)(local_328._8_8_ + 8) + 1;
        }
      }
      pQVar17 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)local_508);
      if (pQVar17 == (QPDF_Dictionary *)0x0) {
        p_Var19 = (_Base_ptr)0x0;
      }
      else {
        p_Var19 = (pQVar17->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      pQVar17 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)local_508);
      p_Var29 = &(pQVar17->items)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar17 == (QPDF_Dictionary *)0x0) {
        p_Var29 = (_Base_ptr)0x0;
      }
      local_150 = p_Var29;
      if (p_Var19 != p_Var29) {
        do {
          bVar9 = QPDFObjectHandle::isStream((QPDFObjectHandle *)(p_Var19 + 2));
          if (bVar9) {
            QPDFObjectHandle::copyStream((QPDFObjectHandle *)&local_2d8);
            QPDFObjectHandle::replaceKeyAndGetNew
                      ((QPDFObjectHandle *)&local_400,(string *)local_328,
                       (QPDFObjectHandle *)(p_Var19 + 1));
            if ((_Base_ptr)local_2d8.b != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.b);
            }
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
            emplace_back<QPDFObjectHandle>
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                       (local_398 + 0x10),(QPDFObjectHandle *)&local_400);
            if ((_Base_ptr)local_400.b != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400.b);
            }
          }
          else {
            local_400.a = *(double *)(p_Var19 + 2);
            local_400.b = (double)p_Var19[2]._M_parent;
            if ((_Base_ptr)local_400.b != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((_Base_ptr)local_400.b)->_M_parent =
                     *(int *)&((_Base_ptr)local_400.b)->_M_parent + 1;
                UNLOCK();
              }
              else {
                *(int *)&((_Base_ptr)local_400.b)->_M_parent =
                     *(int *)&((_Base_ptr)local_400.b)->_M_parent + 1;
              }
            }
            pQVar17 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)&local_400);
            if (pQVar17 == (QPDF_Dictionary *)0x0) {
              p_Var18 = (_Rb_tree_node_base *)0x0;
            }
            else {
              p_Var18 = (pQVar17->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            pQVar17 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)&local_400);
            p_Var30 = &(pQVar17->items)._M_t._M_impl.super__Rb_tree_header._M_header;
            local_148 = p_Var19;
            if (pQVar17 == (QPDF_Dictionary *)0x0) {
              p_Var30 = (_Rb_tree_node_base *)0x0;
            }
            while (p_Var18 != p_Var30) {
              bVar9 = QPDFObjectHandle::isStream((QPDFObjectHandle *)(p_Var18 + 2));
              if (bVar9) {
                QPDFObjectHandle::copyStream((QPDFObjectHandle *)&local_2d8);
                QPDFObjectHandle::replaceKeyAndGetNew
                          ((QPDFObjectHandle *)local_360,(string *)(p_Var19 + 2),
                           (QPDFObjectHandle *)(p_Var18 + 1));
                if ((_Base_ptr)local_2d8.b != (_Base_ptr)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.b);
                }
                std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
                emplace_back<QPDFObjectHandle>
                          ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                           (local_398 + 0x10),(QPDFObjectHandle *)local_360);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._8_8_);
                }
              }
              p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
            }
            p_Var29 = local_150;
            p_Var19 = local_148;
            if ((_Base_ptr)local_400.b != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400.b);
              p_Var29 = local_150;
              p_Var19 = local_148;
            }
          }
          p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
        } while (p_Var19 != p_Var29);
      }
      peVar24 = (element_type *)local_398._16_8_;
      peVar3 = (element_type *)local_398._24_8_;
      pQVar28 = (QPDFAcroFormDocumentHelper *)local_2f8._16_8_;
      pQVar4 = local_160;
      if ((element_type *)local_508._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_);
        peVar24 = (element_type *)local_398._16_8_;
        peVar3 = (element_type *)local_398._24_8_;
        pQVar28 = (QPDFAcroFormDocumentHelper *)local_2f8._16_8_;
        pQVar4 = local_160;
      }
      for (; other = local_160, this = (QPDFAcroFormDocumentHelper *)local_2f8._16_8_,
          uVar8 = local_398._24_8_, local_2f8._16_8_ = pQVar28, local_160 = pQVar4,
          peVar24 != (element_type *)local_398._24_8_;
          peVar24 = (element_type *)
                    ((long)&(peVar24->value).
                            super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    + 0x10)) {
        local_398._24_8_ = peVar3;
        QPDFObjectHandle::getDict((QPDFObjectHandle *)local_360);
        local_2d8.a = (double)&local_2d8.c;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"/Matrix","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_430,(string *)local_360);
        if ((double *)local_2d8.a != &local_2d8.c) {
          operator_delete((void *)local_2d8.a,(ulong)((long)(_func_int ***)local_2d8.c + 1));
        }
        QPDFMatrix::QPDFMatrix(&local_2d8);
        bVar9 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_430);
        if (bVar9) {
          QPDFObjectHandle::getArrayAsMatrix((Matrix *)local_508,(QPDFObjectHandle *)local_430);
          QPDFMatrix::QPDFMatrix(&local_400,(Matrix *)local_508);
          local_2d8.e = local_400.e;
          local_2d8.f = local_400.f;
          local_2d8.c = local_400.c;
          local_2d8.d = local_400.d;
          local_2d8.a = local_400.a;
          local_2d8.b = local_400.b;
        }
        QPDFMatrix::concat(&local_2d8,other);
        QPDFObjectHandle::newFromMatrix((QPDFObjectHandle *)&local_400,&local_2d8);
        bVar9 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_430);
        if (bVar9) {
LAB_00154ff5:
          local_508._0_8_ = local_4f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"/Matrix","");
          QPDFObjectHandle::replaceKey
                    ((QPDFObjectHandle *)local_360,(string *)local_508,
                     (QPDFObjectHandle *)&local_400);
          if ((element_type *)local_508._0_8_ != (element_type *)local_4f8) {
            operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
          }
        }
        else {
          QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_508);
          bVar9 = QPDFMatrix::operator!=(&local_2d8,(QPDFMatrix *)local_508);
          if (bVar9) goto LAB_00154ff5;
        }
        local_508._0_8_ = local_4f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"/Resources","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_328 + 0x20),(string *)local_360);
        if ((undefined1 *)local_508._0_8_ != local_4f8) {
          operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
        }
        if ((local_480 != 0) &&
           (bVar9 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_328 + 0x20)), bVar9))
        {
          local_270.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = *(element_type **)
                    &(peVar24->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          ;
          local_270.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&(peVar24->value).
                        super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                + 8);
          if (local_270.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_270.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_270.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_270.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_270.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::_Rb_tree(&local_98,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)local_4a8);
          adjustAppearanceStream
                    (this,&local_270,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)&local_98);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::~_Rb_tree(&local_98);
          if (local_270.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_270.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        if ((QPDFObjGen)local_328._40_8_ != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._40_8_);
        }
        if ((_Base_ptr)local_400.b != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400.b);
        }
        if ((element_type *)local_430._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._8_8_);
        }
        peVar3 = (element_type *)local_398._24_8_;
        pQVar28 = (QPDFAcroFormDocumentHelper *)local_2f8._16_8_;
        pQVar4 = local_160;
        local_160 = other;
        local_2f8._16_8_ = this;
        local_398._24_8_ = uVar8;
      }
      local_508._0_8_ = local_4f8;
      local_398._24_8_ = peVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"/Rect","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_400,&local_4c8);
      QPDFObjectHandle::getArrayAsRectangle(&local_e8,(QPDFObjectHandle *)&local_400);
      r.lly = local_e8.lly;
      r.llx = local_e8.llx;
      r.urx._0_4_ = local_e8.urx._0_4_;
      r.urx._4_4_ = local_e8.urx._4_4_;
      r.ury._0_4_ = local_e8.ury._0_4_;
      r.ury._4_4_ = local_e8.ury._4_4_;
      QPDFMatrix::transformRectangle((Rectangle *)&local_2d8,other,r);
      if ((_Base_ptr)local_400.b != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400.b);
      }
      if ((element_type *)local_508._0_8_ != (element_type *)local_4f8) {
        operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
      }
      local_508._0_8_ = local_4f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"/Rect","");
      QPDFObjectHandle::newFromRectangle((QPDFObjectHandle *)&local_400,(Rectangle *)&local_2d8);
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)&local_4c8,(string *)local_508,(QPDFObjectHandle *)&local_400);
      if ((_Base_ptr)local_400.b != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400.b);
      }
      if ((element_type *)local_508._0_8_ != (element_type *)local_4f8) {
        operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)(local_398 + 0x10));
      if ((element_type *)local_328._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
      }
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_548);
      if ((QPDFObjGen)local_430._32_8_ != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430._32_8_);
      }
      if ((element_type *)
          local_468.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_468.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)local_3d0);
    }
    if ((QPDFObjGen)local_4c8._M_string_length != (QPDFObjGen)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c8._M_string_length);
    }
    QPDFObjectHandle::QPDFArrayItems::iterator::operator++(&local_138);
  } while( true );
}

Assistant:

void
QPDFAcroFormDocumentHelper::transformAnnotations(
    QPDFObjectHandle old_annots,
    std::vector<QPDFObjectHandle>& new_annots,
    std::vector<QPDFObjectHandle>& new_fields,
    std::set<QPDFObjGen>& old_fields,
    QPDFMatrix const& cm,
    QPDF* from_qpdf,
    QPDFAcroFormDocumentHelper* from_afdh)
{
    std::shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
    if (!from_qpdf) {
        // Assume these are from the same QPDF.
        from_qpdf = &qpdf;
        from_afdh = this;
    } else if ((from_qpdf != &qpdf) && (!from_afdh)) {
        afdhph = std::make_shared<QPDFAcroFormDocumentHelper>(*from_qpdf);
        from_afdh = afdhph.get();
    }
    bool foreign = (from_qpdf != &qpdf);

    // It's possible that we will transform annotations that don't include any form fields. This
    // code takes care not to muck around with /AcroForm unless we have to.

    QPDFObjectHandle acroform = qpdf.getRoot().getKey("/AcroForm");
    QPDFObjectHandle from_acroform = from_qpdf->getRoot().getKey("/AcroForm");

    // /DA and /Q may be inherited from the document-level /AcroForm dictionary. If we are copying a
    // foreign stream and the stream is getting one of these values from its document's /AcroForm,
    // we will need to copy the value explicitly so that it doesn't start getting its default from
    // the destination document.
    bool override_da = false;
    bool override_q = false;
    std::string from_default_da;
    int from_default_q = 0;
    // If we copy any form fields, we will need to merge the source document's /DR into this
    // document's /DR.
    QPDFObjectHandle from_dr = QPDFObjectHandle::newNull();
    if (foreign) {
        std::string default_da;
        int default_q = 0;
        if (acroform.isDictionary()) {
            if (acroform.getKey("/DA").isString()) {
                default_da = acroform.getKey("/DA").getUTF8Value();
            }
            if (acroform.getKey("/Q").isInteger()) {
                default_q = acroform.getKey("/Q").getIntValueAsInt();
            }
        }
        if (from_acroform.isDictionary()) {
            if (from_acroform.getKey("/DR").isDictionary()) {
                from_dr = from_acroform.getKey("/DR");
                if (!from_dr.isIndirect()) {
                    from_dr = from_qpdf->makeIndirectObject(from_dr);
                }
                from_dr = qpdf.copyForeignObject(from_dr);
            }
            if (from_acroform.getKey("/DA").isString()) {
                from_default_da = from_acroform.getKey("/DA").getUTF8Value();
            }
            if (from_acroform.getKey("/Q").isInteger()) {
                from_default_q = from_acroform.getKey("/Q").getIntValueAsInt();
            }
        }
        if (from_default_da != default_da) {
            override_da = true;
        }
        if (from_default_q != default_q) {
            override_q = true;
        }
    }

    // If we have to merge /DR, we will need a mapping of conflicting keys for rewriting /DA. Set
    // this up for lazy initialization in case we encounter any form fields.
    std::map<std::string, std::map<std::string, std::string>> dr_map;
    bool initialized_dr_map = false;
    QPDFObjectHandle dr = QPDFObjectHandle::newNull();
    auto init_dr_map = [&]() {
        if (!initialized_dr_map) {
            initialized_dr_map = true;
            // Ensure that we have a /DR that is an indirect
            // dictionary object.
            if (!acroform.isDictionary()) {
                acroform = getOrCreateAcroForm();
            }
            dr = acroform.getKey("/DR");
            if (!dr.isDictionary()) {
                dr = QPDFObjectHandle::newDictionary();
            }
            dr.makeResourcesIndirect(qpdf);
            if (!dr.isIndirect()) {
                dr = acroform.replaceKeyAndGetNew("/DR", qpdf.makeIndirectObject(dr));
            }
            // Merge the other document's /DR, creating a conflict map. mergeResources checks to
            // make sure both objects are dictionaries. By this point, if this is foreign, from_dr
            // has been copied, so we use the target qpdf as the owning qpdf.
            from_dr.makeResourcesIndirect(qpdf);
            dr.mergeResources(from_dr, &dr_map);

            if (from_afdh->getNeedAppearances()) {
                setNeedAppearances(true);
            }
        }
    };

    // This helper prevents us from copying the same object multiple times.
    std::map<QPDFObjGen, QPDFObjectHandle> orig_to_copy;
    auto maybe_copy_object = [&](QPDFObjectHandle& to_copy) {
        auto og = to_copy.getObjGen();
        if (orig_to_copy.count(og)) {
            to_copy = orig_to_copy[og];
            return false;
        } else {
            to_copy = qpdf.makeIndirectObject(to_copy.shallowCopy());
            orig_to_copy[og] = to_copy;
            return true;
        }
    };

    // Now do the actual copies.

    QPDFObjGen::set added_new_fields;
    for (auto annot: old_annots.aitems()) {
        if (annot.isStream()) {
            annot.warnIfPossible("ignoring annotation that's a stream");
            continue;
        }

        // Make copies of annotations and fields down to the appearance streams, preserving all
        // internal referential integrity. When the incoming annotations are from a different file,
        // we first copy them locally. Then, whether local or foreign, we copy them again so that if
        // we bring the same annotation in multiple times (e.g. overlaying a foreign page onto
        // multiple local pages or a local page onto multiple other local pages), we don't create
        // annotations that are referenced in more than one place. If we did that, the effect of
        // applying transformations would be cumulative, which is definitely not what we want.
        // Besides, annotations and fields are not intended to be referenced in multiple places.

        // Determine if this annotation is attached to a form field. If so, the annotation may be
        // the same object as the form field, or the form field may have the annotation as a kid. In
        // either case, we have to walk up the field structure to find the top-level field. Within
        // one iteration through a set of annotations, we don't want to copy the same item more than
        // once. For example, suppose we have field A with kids B, C, and D, each of which has
        // annotations BA, CA, and DA. When we get to BA, we will find that BA is a kid of B which
        // is under A. When we do a copyForeignObject of A, it will also copy everything else
        // because of the indirect references. When we clone BA, we will want to clone A and then
        // update A's clone's kid to point B's clone and B's clone's parent to point to A's clone.
        // The same thing holds for annotations. Next, when we get to CA, we will again discover
        // that A is the top, but we don't want to re-copy A. We want CA's clone to be linked to the
        // same clone as BA's. Failure to do this will break up things like radio button groups,
        // which all have to kids of the same parent.

        auto ffield = from_afdh->getFieldForAnnotation(annot);
        auto ffield_oh = ffield.getObjectHandle();
        QPDFObjectHandle top_field;
        bool have_field = false;
        bool have_parent = false;
        if (ffield_oh.isStream()) {
            ffield_oh.warnIfPossible("ignoring form field that's a stream");
        } else if ((!ffield_oh.isNull()) && (!ffield_oh.isIndirect())) {
            ffield_oh.warnIfPossible("ignoring form field not indirect");
        } else if (!ffield_oh.isNull()) {
            // A field and its associated annotation can be the same object. This matters because we
            // don't want to clone the annotation and field separately in this case.
            have_field = true;
            // Find the top-level field. It may be the field itself.
            top_field = ffield.getTopLevelField(&have_parent).getObjectHandle();
            if (foreign) {
                // copyForeignObject returns the same value if called multiple times with the same
                // field. Create/retrieve the local copy of the original field. This pulls over
                // everything the field references including annotations and appearance streams, but
                // it's harmless to call copyForeignObject on them too. They will already be copied,
                // so we'll get the right object back.

                // top_field and ffield_oh are known to be indirect.
                top_field = qpdf.copyForeignObject(top_field);
                ffield_oh = qpdf.copyForeignObject(ffield_oh);
            } else {
                // We don't need to add top_field to old_fields if it's foreign because the new copy
                // of the foreign field won't be referenced anywhere. It's just the starting point
                // for us to make an additional local copy of.
                old_fields.insert(top_field.getObjGen());
            }

            // Traverse the field, copying kids, and preserving integrity.
            std::list<QPDFObjectHandle> queue;
            QPDFObjGen::set seen;
            if (maybe_copy_object(top_field)) {
                queue.push_back(top_field);
            }
            for (; !queue.empty(); queue.pop_front()) {
                auto& obj = queue.front();
                if (seen.add(obj)) {
                    auto parent = obj.getKey("/Parent");
                    if (parent.isIndirect()) {
                        auto parent_og = parent.getObjGen();
                        if (orig_to_copy.count(parent_og)) {
                            obj.replaceKey("/Parent", orig_to_copy[parent_og]);
                        } else {
                            parent.warnIfPossible(
                                "while traversing field " + obj.getObjGen().unparse(',') +
                                ", found parent (" + parent_og.unparse(',') +
                                ") that had not been seen, indicating likely invalid field "
                                "structure");
                        }
                    }
                    auto kids = obj.getKey("/Kids");
                    if (kids.isArray()) {
                        for (int i = 0; i < kids.getArrayNItems(); ++i) {
                            auto kid = kids.getArrayItem(i);
                            if (maybe_copy_object(kid)) {
                                kids.setArrayItem(i, kid);
                                queue.push_back(kid);
                            }
                        }
                    }

                    if (override_da || override_q) {
                        adjustInheritedFields(
                            obj, override_da, from_default_da, override_q, from_default_q);
                    }
                    if (foreign) {
                        // Lazily initialize our /DR and the conflict map.
                        init_dr_map();
                        // The spec doesn't say anything about /DR on the field, but lots of writers
                        // put one there, and it is frequently the same as the document-level /DR.
                        // To avoid having the field's /DR point to information that we are not
                        // maintaining, just reset it to that if it exists. Empirical evidence
                        // suggests that many readers, including Acrobat, Adobe Acrobat Reader,
                        // chrome, firefox, the mac Preview application, and several of the free
                        // readers on Linux all ignore /DR at the field level.
                        if (obj.hasKey("/DR")) {
                            obj.replaceKey("/DR", dr);
                        }
                    }
                    if (foreign && obj.getKey("/DA").isString() && (!dr_map.empty())) {
                        adjustDefaultAppearances(obj, dr_map);
                    }
                }
            }

            // Now switch to copies. We already switched for top_field
            maybe_copy_object(ffield_oh);
            ffield = QPDFFormFieldObjectHelper(ffield_oh);
        }

        QTC::TC(
            "qpdf",
            "QPDFAcroFormDocumentHelper copy annotation",
            (have_field ? 1 : 0) | (foreign ? 2 : 0));
        if (have_field) {
            QTC::TC(
                "qpdf",
                "QPDFAcroFormDocumentHelper field with parent",
                (have_parent ? 1 : 0) | (foreign ? 2 : 0));
        }
        if (foreign) {
            if (!annot.isIndirect()) {
                annot = from_qpdf->makeIndirectObject(annot);
            }
            annot = qpdf.copyForeignObject(annot);
        }
        maybe_copy_object(annot);

        // Now we have copies, so we can safely mutate.
        if (have_field && added_new_fields.add(top_field)) {
            new_fields.push_back(top_field);
        }
        new_annots.push_back(annot);

        // Identify and copy any appearance streams

        auto ah = QPDFAnnotationObjectHelper(annot);
        auto apdict = ah.getAppearanceDictionary();
        std::vector<QPDFObjectHandle> streams;
        auto replace_stream = [](auto& dict, auto& key, auto& old) {
            return dict.replaceKeyAndGetNew(key, old.copyStream());
        };

        for (auto& [key1, value1]: apdict.as_dictionary()) {
            if (value1.isStream()) {
                streams.emplace_back(replace_stream(apdict, key1, value1));
            } else {
                for (auto& [key2, value2]: value1.as_dictionary()) {
                    if (value2.isStream()) {
                        streams.emplace_back(replace_stream(value1, key2, value2));
                    }
                }
            }
        }

        // Now we can safely mutate the annotation and its appearance streams.
        for (auto& stream: streams) {
            auto dict = stream.getDict();
            auto omatrix = dict.getKey("/Matrix");
            QPDFMatrix apcm;
            if (omatrix.isArray()) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper modify ap matrix");
                auto m1 = omatrix.getArrayAsMatrix();
                apcm = QPDFMatrix(m1);
            }
            apcm.concat(cm);
            auto new_matrix = QPDFObjectHandle::newFromMatrix(apcm);
            if (omatrix.isArray() || (apcm != QPDFMatrix())) {
                dict.replaceKey("/Matrix", new_matrix);
            }
            auto resources = dict.getKey("/Resources");
            if ((!dr_map.empty()) && resources.isDictionary()) {
                adjustAppearanceStream(stream, dr_map);
            }
        }
        auto rect = cm.transformRectangle(annot.getKey("/Rect").getArrayAsRectangle());
        annot.replaceKey("/Rect", QPDFObjectHandle::newFromRectangle(rect));
    }
}